

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPetNet.cpp
# Opt level: O2

void __thiscall NaPetriNet::terminate(NaPetriNet *this,bool bDoPrintouts)

{
  NaPNodePtrAr *pNVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  NaPetriConnector *pNVar6;
  undefined4 extraout_var_06;
  byte bVar7;
  uint uVar8;
  sigaction sa_old;
  sigaction sa;
  
  bVar7 = bDoPrintouts | this->bTermPrintout;
  if (bVar7 == 1) {
    NaPrintLog("# net \'%s\', obtain statistics:\n",this->szName);
    pNVar1 = &this->pnaNet;
    for (uVar8 = 0; (int)uVar8 < (this->pnaNet).nItems; uVar8 = uVar8 + 1) {
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      pcVar5 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var,iVar3));
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      uVar2 = *(uint *)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x3c);
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      NaPrintLog(" * node \'%s\' was called %u times and %u times was activated.\n",pcVar5,
                 (ulong)uVar2,(ulong)*(uint *)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x40));
    }
    NaPrintLog("# net \'%s\', phase #10: deallocation and closing data.\n",this->szName);
  }
  pNVar1 = &this->pnaNet;
  for (uVar8 = 0; iVar3 = (this->pnaNet).nItems, (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
    if (bVar7 != 0) {
      iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      pcVar5 = NaPetriNode::name(*(NaPetriNode **)CONCAT44(extraout_var_02,iVar3));
      NaPrintLog("node \'%s\'\n",pcVar5);
    }
    iVar3 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
    (**(code **)(**(long **)CONCAT44(extraout_var_03,iVar3) + 0xa0))();
  }
  for (uVar8 = 0; (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
    iVar3 = 0;
    while( true ) {
      iVar4 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      iVar4 = NaPetriNode::connectors(*(NaPetriNode **)CONCAT44(extraout_var_04,iVar4));
      if (iVar4 <= iVar3) break;
      iVar4 = (*pNVar1->_vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
      pNVar6 = NaPetriNode::connector(*(NaPetriNode **)CONCAT44(extraout_var_05,iVar4),iVar3);
      (*pNVar6->_vptr_NaPetriConnector[6])(pNVar6);
      iVar3 = iVar3 + 1;
    }
    iVar3 = (this->pnaNet).nItems;
  }
  for (uVar8 = 0; (int)uVar8 < iVar3; uVar8 = uVar8 + 1) {
    iVar3 = (*(this->pnaNet)._vptr_NaDynAr[0xf])(pNVar1,(ulong)uVar8);
    *(undefined1 *)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x39) = 1;
    iVar3 = (this->pnaNet).nItems;
  }
  if (this->dfTimeChart != (NaDataFile *)0x0) {
    (*this->dfTimeChart->_vptr_NaDataFile[1])();
    this->dfTimeChart = (NaDataFile *)0x0;
  }
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sigaction(2,(sigaction *)&sa,(sigaction *)&sa_old);
  sigaction(0xf,(sigaction *)&sa,(sigaction *)&sa_old);
  sigaction(3,(sigaction *)&sa,(sigaction *)&sa_old);
  if ((FILE *)this->fpMap != (FILE *)0x0) {
    fclose((FILE *)this->fpMap);
    this->fpMap = (FILE *)0x0;
  }
  return;
}

Assistant:

void
NaPetriNet::terminate (bool bDoPrintouts)
{
    int     iNode;

    if(bTermPrintout)
      bDoPrintouts = bTermPrintout;

    if(bDoPrintouts){
      // Get statistics from each node
      NaPrintLog("# net '%s', obtain statistics:\n", name());
      for(iNode = 0; iNode < pnaNet.count(); ++iNode){
	NaPrintLog(" * node '%s' was called %u times and %u times "\
		   "was activated.\n",
		   pnaNet[iNode]->name(),
		   pnaNet[iNode]->nCalls,
		   pnaNet[iNode]->nActivations);
      }

      NaPrintLog("# net '%s', phase #10: deallocation and closing data.\n",
		 name());
    }

    // 10. Deallocate resources and close external data
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        try{
            if(bDoPrintouts){
		NaPrintLog("node '%s'\n", pnaNet[iNode]->name());
            }
            pnaNet[iNode]->release_and_close();
        }catch(NaException exCode){
            NaPrintLog("Deallocate resources phase (#10): node '%s' fault.\n"
                       "Caused by exception: %s\n",
                       pnaNet[iNode]->name(), NaExceptionMsg(exCode));
        }
    }

    // Call final() for each connector
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        // Need to shutdown connections
        int iCn;
        for(iCn = 0; iCn < pnaNet[iNode]->connectors(); ++iCn){
	  try{
            pnaNet[iNode]->connector(iCn)->final();
	  }catch(NaException exCode){
            NaPrintLog("Failure at %s.%s.%s.final().\n"
                       "Caused by exception: %s\n",
		       name(), pnaNet[iNode]->name(),
		       pnaNet[iNode]->connector(iCn)->name(),
		       NaExceptionMsg(exCode));
	  }
        }
    }

    // Allow changes of node parameters
    for(iNode = 0; iNode < pnaNet.count(); ++iNode){
        pnaNet[iNode]->bTunable = true;
    }

    if(NULL != dfTimeChart){
        delete dfTimeChart;
        dfTimeChart = NULL;
    }

#if defined(unix)
    // Reset the signal handler
    struct sigaction	sa, sa_old;
    sa.sa_handler = SIG_DFL;
    sigaction(SIGINT, &sa, &sa_old);
    sigaction(SIGTERM, &sa, &sa_old);
    sigaction(SIGQUIT, &sa, &sa_old);
#endif /* unix */

    /* Close activation map file */
    if(NULL != fpMap)
      {
	fclose(fpMap);
	fpMap = NULL;
      }
}